

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boxed_value.hpp
# Opt level: O0

shared_ptr<chaiscript::Boxed_Value::Data>
chaiscript::Boxed_Value::Object_Data::get<chaiscript::parser::ChaiScript_Parser>
          (shared_ptr<chaiscript::parser::ChaiScript_Parser> *obj,bool t_return_value)

{
  element_type *__args_4;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  __shared_ptr<chaiscript::parser::ChaiScript_Parser,_(__gnu_cxx::_Lock_policy)2> *in_RSI;
  element_type *in_RDI;
  shared_ptr<chaiscript::Boxed_Value::Data> sVar1;
  undefined7 in_stack_ffffffffffffffc0;
  undefined1 uVar2;
  shared_ptr<chaiscript::parser::ChaiScript_Parser> *in_stack_ffffffffffffffc8;
  Any *in_stack_ffffffffffffffd0;
  Type_Info *in_stack_ffffffffffffffd8;
  
  chaiscript::detail::Get_Type_Info<chaiscript::parser::ChaiScript_Parser>::get();
  chaiscript::detail::Any::Any<std::shared_ptr<chaiscript::parser::ChaiScript_Parser>const&,void>
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  uVar2 = 0;
  __args_4 = std::__shared_ptr<chaiscript::parser::ChaiScript_Parser,_(__gnu_cxx::_Lock_policy)2>::
             get(in_RSI);
  std::
  make_shared<chaiscript::Boxed_Value::Data,chaiscript::Type_Info,chaiscript::detail::Any,bool,chaiscript::parser::ChaiScript_Parser*,bool&>
            (in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,(bool *)in_stack_ffffffffffffffc8,
             (ChaiScript_Parser **)CONCAT17(uVar2,in_stack_ffffffffffffffc0),(bool *)__args_4);
  chaiscript::detail::Any::~Any((Any *)0x3d58a8);
  sVar1.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = extraout_RDX._M_pi;
  sVar1.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       in_RDI;
  return (shared_ptr<chaiscript::Boxed_Value::Data>)
         sVar1.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

static std::shared_ptr<Data> get(const std::shared_ptr<T> &obj, bool t_return_value)
          {
            return std::make_shared<Data>(
                  detail::Get_Type_Info<T>::get(), 
                  chaiscript::detail::Any(obj), 
                  false,
                  obj.get(),
                  t_return_value
                );
          }